

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

uint64_t memory_region_shift_write_access(uint64_t *value,int shift,uint64_t mask)

{
  undefined8 local_28;
  uint64_t tmp;
  uint64_t mask_local;
  int shift_local;
  uint64_t *value_local;
  
  if (shift < 0) {
    local_28 = *value << (-(byte)shift & 0x3f);
  }
  else {
    local_28 = *value >> ((byte)shift & 0x3f);
  }
  local_28 = local_28 & mask;
  return local_28;
}

Assistant:

static inline uint64_t memory_region_shift_write_access(uint64_t *value,
                                                        signed shift,
                                                        uint64_t mask)
{
    uint64_t tmp;

    if (shift >= 0) {
        tmp = (*value >> shift) & mask;
    } else {
        tmp = (*value << -shift) & mask;
    }

    return tmp;
}